

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)

{
  uint64_t uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = 0;
  do {
    uVar1 = _stm_refresh_rates[uVar3][0];
    if (uVar1 == 0) {
      return duration;
    }
    bVar4 = duration <= uVar1 - _stm_refresh_rates[uVar3][1];
    bVar2 = _stm_refresh_rates[uVar3][1] + uVar1 <= duration;
    uVar3 = uVar3 + (bVar2 || bVar4);
  } while (bVar2 || bVar4);
  return uVar1;
}

Assistant:

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)
{
    return stm_round_to_common_refresh_rate(duration);
}